

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void pixels::compareExact(uint16_t a,uint16_t b,int x,int y,char *taga,char *tagb,char *chan)

{
  ostream *poVar1;
  ostream *poVar2;
  int in_ECX;
  int in_EDX;
  ushort in_SI;
  ushort in_DI;
  char *in_R8;
  char *in_R9;
  float fVar3;
  char *in_stack_00000008;
  char *in_stack_ffffffffffffffc8;
  uint line;
  
  if (in_DI != in_SI) {
    poVar1 = std::operator<<((ostream *)&std::cout,in_stack_00000008);
    poVar1 = std::operator<<(poVar1," half at ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ECX);
    poVar1 = std::operator<<(poVar1," not equal: ");
    poVar1 = std::operator<<(poVar1,in_R8);
    poVar1 = std::operator<<(poVar1," 0x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_DI);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = std::operator<<(poVar1," (");
    fVar3 = imath_half_to_float(in_DI);
    poVar2 = (ostream *)std::ostream::operator<<(poVar1,fVar3);
    line = (uint)((ulong)poVar1 >> 0x20);
    poVar1 = std::operator<<(poVar2,") vs ");
    poVar1 = std::operator<<(poVar1,in_R9);
    poVar1 = std::operator<<(poVar1," 0x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_SI);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = std::operator<<(poVar1," (");
    fVar3 = imath_half_to_float(in_SI);
    poVar2 = (ostream *)std::ostream::operator<<(poVar1,fVar3);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_R9,(char *)poVar1,line,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static inline void compareExact (
        uint16_t    a,
        uint16_t    b,
        int         x,
        int         y,
        const char* taga,
        const char* tagb,
        const char* chan)
    {
        if (a != b)
        {
            std::cout << chan << " half at " << std::dec << x << ", " << y
                      << " not equal: " << taga << " 0x" << std::hex << a
                      << std::dec << " (" << imath_half_to_float (a) << ") vs "
                      << tagb << " 0x" << std::hex << b << std::hex << " ("
                      << imath_half_to_float (b) << ")" << std::dec
                      << std::endl;
        }
        EXRCORE_TEST (a == b);
    }